

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# duckdb_functions.cpp
# Opt level: O2

Value * duckdb::AggregateFunctionExtractor::GetReturnType
                  (Value *__return_storage_ptr__,AggregateFunctionCatalogEntry *entry,idx_t offset)

{
  string sStack_158;
  AggregateFunction local_138;
  
  FunctionSet<duckdb::AggregateFunction>::GetFunctionByOffset
            (&local_138,&(entry->functions).super_FunctionSet<duckdb::AggregateFunction>,offset);
  LogicalType::ToString_abi_cxx11_(&sStack_158,&local_138.super_BaseScalarFunction.return_type);
  Value::Value(__return_storage_ptr__,(string *)&sStack_158);
  ::std::__cxx11::string::~string((string *)&sStack_158);
  AggregateFunction::~AggregateFunction(&local_138);
  return __return_storage_ptr__;
}

Assistant:

static Value GetReturnType(AggregateFunctionCatalogEntry &entry, idx_t offset) {
		return Value(entry.functions.GetFunctionByOffset(offset).return_type.ToString());
	}